

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  i64 iVar15;
  long lVar16;
  
  lVar11 = (long)length;
  uVar6 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar6 == 1) {
    uVar6 = 1;
    bVar3 = false;
    pbVar10 = (byte *)zNum;
  }
  else {
    lVar13 = 0x300000000 - ((ulong)enc << 0x20);
    for (lVar14 = (long)(int)(3 - uVar6);
        (bVar3 = lVar14 < lVar11, lVar14 < lVar11 && (zNum[lVar14] == '\0')); lVar14 = lVar14 + 2) {
      lVar13 = lVar13 + 0x200000000;
    }
    lVar11 = (ulong)enc + (lVar13 >> 0x20) + -3;
    pbVar10 = (byte *)(zNum + (uVar6 & 1));
    uVar6 = 2;
  }
  pbVar12 = (byte *)(zNum + lVar11);
  iVar5 = 1;
  uVar7 = (ulong)uVar6;
  do {
    bVar4 = true;
    if (pbVar12 <= pbVar10) {
LAB_00140510:
      lVar11 = 0;
      for (; (pbVar10 < pbVar12 && (*pbVar10 == 0x30)); pbVar10 = pbVar10 + uVar7) {
        lVar11 = lVar11 - uVar7;
      }
      lVar14 = 0;
      uVar8 = 0;
      for (lVar13 = 0;
          (pbVar1 = pbVar10 + lVar13, pbVar1 < pbVar12 &&
          (uVar8 = (uint)(char)*pbVar1, (byte)(*pbVar1 - 0x30) < 10)); lVar13 = lVar13 + uVar7) {
        lVar14 = lVar14 * 10 + (ulong)uVar8 + -0x30;
      }
      lVar16 = -lVar14;
      if (bVar4) {
        lVar16 = lVar14;
      }
      iVar15 = -0x8000000000000000;
      if (-1 < lVar14) {
        iVar15 = lVar16;
      }
      *pNum = iVar15;
      if ((pbVar12 <= pbVar1 || uVar8 == 0) && (lVar11 != 0 || lVar13 != 0)) {
        if (!bVar3 && (uint)lVar13 <= uVar6 * 0x13) {
          if (uVar6 * 0x13 <= (uint)lVar13) {
            iVar5 = 0;
            pbVar12 = pbVar10;
            for (uVar9 = 0; (iVar5 == 0 && (uVar9 < 0x12)); uVar9 = uVar9 + 1) {
              iVar5 = ((int)(char)*pbVar12 - (int)"922337203685477580"[uVar9]) * 10;
              pbVar12 = pbVar12 + uVar7;
            }
            if (iVar5 == 0) {
              iVar5 = (char)pbVar10[uVar7 * 0x12] + -0x38;
            }
            if (-1 < iVar5) {
              if (iVar5 != 0) {
                return 1;
              }
              return (uint)bVar4 * 2;
            }
          }
          iVar5 = 0;
        }
      }
      return iVar5;
    }
    bVar2 = *pbVar10;
    if ((""[bVar2] & 1) == 0) {
      if (bVar2 == 0x2b) {
        pbVar10 = pbVar10 + uVar7;
      }
      else if (bVar2 == 0x2d) {
        pbVar10 = pbVar10 + uVar7;
        bVar4 = false;
      }
      goto LAB_00140510;
    }
    pbVar10 = pbVar10 + uVar7;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = zNum+i+enc-3;
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = SMALLEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( (c!=0 && &zNum[i]<zEnd) || (i==0 && zStart==zNum) || i>19*incr || nonNum ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      assert( (*pNum)==SMALLEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}